

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stream.hpp
# Opt level: O0

size_t __thiscall
io::basic_string_stream<char,_std::char_traits<char>_>::write_some<io::net::const_buffer>
          (basic_string_stream<char,_std::char_traits<char>_> *this,const_buffer *cb,error_code *ec)

{
  size_t sVar1;
  char *pcVar2;
  void *pvVar3;
  stream_position<long> local_48;
  const_buffer *local_40;
  const_buffer *last;
  const_buffer *first;
  size_t total_bytes_written;
  error_code *ec_local;
  const_buffer *cb_local;
  basic_string_stream<char,_std::char_traits<char>_> *this_local;
  
  total_bytes_written = (size_t)ec;
  ec_local = (error_code *)cb;
  cb_local = (const_buffer *)this;
  std::error_code::clear(ec);
  sVar1 = net::buffer_size((const_buffer *)ec_local);
  if (sVar1 == 0) {
    this_local = (basic_string_stream<char,_std::char_traits<char>_> *)0x0;
  }
  else {
    first = (const_buffer *)0x0;
    last = net::buffer_sequence_begin((const_buffer *)ec_local);
    local_40 = net::buffer_sequence_end((const_buffer *)ec_local);
    for (; last != local_40; last = last + 1) {
      local_48.pos_ =
           (offset_type)
           detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
           ::get_position(&this->
                           super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                         );
      pcVar2 = (char *)stream_position<long>::offset_from_start(&local_48);
      pvVar3 = net::const_buffer::data(last);
      net::const_buffer::size(last);
      std::__cxx11::string::insert((ulong)&this->str_,pcVar2,(ulong)pvVar3);
      sVar1 = net::const_buffer::size(last);
      first = (const_buffer *)((long)&first->data_ + sVar1);
      sVar1 = net::const_buffer::size(last);
      detail::memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>::seek
                (&this->
                  super_memory_stream_impl<io::basic_string_stream<char,_std::char_traits<char>_>,_long>
                 ,sVar1,current,(error_code *)total_bytes_written);
    }
    this_local = (basic_string_stream<char,_std::char_traits<char>_> *)first;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t write_some(const ConstBufSeq& cb, std::error_code& ec)
    {
        static_assert(is_const_buffer_sequence_v<ConstBufSeq>,
                      "Argument passed to write_some() is not a ConstBufferSequence");

        ec.clear();

        if (io::buffer_size(cb) == 0) {
            return 0;
        }

        std::size_t total_bytes_written = 0;
        auto first = io::buffer_sequence_begin(cb);
        auto last = io::buffer_sequence_end(cb);

        while (first != last) {
            str_.insert(this->get_position().offset_from_start(),
                        reinterpret_cast<const char_type*>(first->data()),
                        first->size()/sizeof(char_type));
            total_bytes_written += first->size();
            this->seek(first->size(), seek_mode::current, ec);
            ++first;
        }

        return total_bytes_written;
    }